

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

CTcCodeLabel * __thiscall
CTPNCodeBody::add_named_arg_tab(CTPNCodeBody *this,CTcNamedArgs *named_args)

{
  CTcNamedArgTab *this_00;
  
  this_00 = (CTcNamedArgTab *)CTcPrsMem::alloc(G_prsmem,0x20);
  CTcNamedArgTab::CTcNamedArgTab(this_00,named_args);
  this_00->nxt = this->named_arg_tables_;
  this->named_arg_tables_ = this_00;
  return this_00->lbl;
}

Assistant:

CTcCodeLabel *CTPNCodeBody::add_named_arg_tab(const CTcNamedArgs *named_args)
{
    /* allocate the tracking object */
    CTcNamedArgTab *tab = new (G_prsmem) CTcNamedArgTab(named_args);

    /* link it into our list */
    tab->nxt = named_arg_tables_;
    named_arg_tables_ = tab;

    /* return the code label for the table */
    return tab->lbl;
}